

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::anon_unknown_1::ShaderOptimizationCase::init
          (ShaderOptimizationCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  int *piVar2;
  TestLog *pTVar3;
  SharedPtrStateBase *pSVar4;
  long *plVar5;
  ShaderProgram *this_00;
  SharedPtrStateBase *pSVar6;
  TestError *this_01;
  ProgramSources *sources;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  ScopedLogSection section;
  string local_168;
  ScopedLogSection local_140;
  TestLog *local_138;
  ProgramSources *local_130;
  ProgramSources *local_128;
  RenderContext *local_120;
  string local_118 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_88;
  deUint32 local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  bool local_50;
  vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_> local_48;
  
  local_120 = ((this->super_TestCase).m_context)->m_renderCtx;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deqp::gls::ShaderPerformanceMeasurer::logParameters(&this->m_measurer,pTVar3);
  local_128 = &(this->m_unoptimizedData).sources;
  local_130 = &(this->m_optimizedData).sources;
  iVar10 = 0;
  local_138 = pTVar3;
  while( true ) {
    sources = local_128;
    if (iVar10 != 0) {
      sources = local_130;
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (local_118,this,(ulong)(iVar10 != 0));
    lVar9 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&sources->sources[0].
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar9),
                       (long)&local_118[0]._M_dataplus._M_p + lVar9);
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x90);
    local_168._M_dataplus._M_p =
         (pointer)(sources->attribLocationBindings).
                  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_168._M_string_length =
         (size_type)
         (sources->attribLocationBindings).
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_168.field_2._M_allocated_capacity =
         (size_type)
         (sources->attribLocationBindings).
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (sources->attribLocationBindings).
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_88.
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (sources->attribLocationBindings).
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (sources->attribLocationBindings).
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
               &local_168);
    sources->transformFeedbackBufferMode = local_70;
    local_168._M_dataplus._M_p =
         (pointer)(sources->transformFeedbackVaryings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_168._M_string_length =
         (size_type)
         (sources->transformFeedbackVaryings).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_168.field_2._M_allocated_capacity =
         (size_type)
         (sources->transformFeedbackVaryings).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (sources->transformFeedbackVaryings).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (sources->transformFeedbackVaryings).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (sources->transformFeedbackVaryings).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    sources->separable = local_50;
    local_168._M_dataplus._M_p =
         (pointer)sources[1].sources[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_168._M_string_length =
         (size_type)
         sources[1].sources[0].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_168.field_2._M_allocated_capacity =
         (size_type)
         sources[1].sources[0].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sources[1].sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         &(local_48.
           super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl
           .super__Vector_impl_data._M_start)->name;
    sources[1].sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         &(local_48.
           super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl
           .super__Vector_impl_data._M_finish)->name;
    sources[1].sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         &(local_48.
           super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage)->name;
    local_48.super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::~vector
              ((vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_> *)&local_168);
    std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::~vector(&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_88);
    lVar9 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_118[0]._M_dataplus._M_p + lVar9));
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != -0x18);
    this_00 = (ShaderProgram *)operator_new(0xd0);
    glu::ShaderProgram::ShaderProgram(this_00,local_120,sources);
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0217e258;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSVar4 = (&this->m_unoptimizedProgram)[iVar10 != 0].m_state;
    uVar8 = (ulong)(iVar10 != 0) * 0x10 | 800;
    if (pSVar4 != pSVar6) {
      if (pSVar4 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar4->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          *(undefined8 *)
           ((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + uVar8) = 0;
          (**(code **)(**(long **)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                          m_testCtx + uVar8) + 0x10))();
        }
        LOCK();
        piVar2 = (int *)(*(long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                          m_testCtx + uVar8) + 0xc);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          plVar5 = *(long **)((long)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx
                             + uVar8);
          if (plVar5 != (long *)0x0) {
            (**(code **)(*plVar5 + 8))();
          }
          *(undefined8 *)
           ((long)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx + uVar8) = 0;
        }
      }
      *(ShaderProgram **)
       ((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + uVar8) =
           this_00;
      *(SharedPtrStateBase **)
       ((long)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx + uVar8) = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      piVar2 = (int *)(*(long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                        m_testCtx + uVar8) + 0xc);
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    LOCK();
    pdVar1 = &pSVar6->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar6->_vptr_SharedPtrStateBase[2])(pSVar6);
    }
    LOCK();
    pdVar1 = &pSVar6->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*pSVar6->_vptr_SharedPtrStateBase[1])(pSVar6);
    }
    pcVar7 = "UnoptimizedProgram";
    if (iVar10 != 0) {
      pcVar7 = "OptimizedProgram";
    }
    local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,pcVar7,pcVar7 + (ulong)(iVar10 == 0) * 2 + 0x10);
    pcVar7 = "Unoptimized program";
    if (iVar10 != 0) {
      pcVar7 = "Hand-optimized program";
    }
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,pcVar7,pcVar7 + (ulong)(iVar10 != 0) * 3 + 0x13);
    pTVar3 = local_138;
    tcu::ScopedLogSection::ScopedLogSection(&local_140,local_138,local_118,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      (ulong)(local_168.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
      operator_delete(local_118[0]._M_dataplus._M_p,local_118[0].field_2._M_allocated_capacity + 1);
    }
    glu::operator<<(pTVar3,*(ShaderProgram **)
                            ((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                    _vptr_TestNode + uVar8));
    tcu::TestLog::endSection(local_140.m_log);
    if (*(char *)(*(long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                   _vptr_TestNode + uVar8) + 0xc0) == '\0') break;
    bVar11 = iVar10 != 0;
    iVar10 = iVar10 + 1;
    if (bVar11) {
      this->m_state = STATE_INIT_UNOPTIMIZED;
      return (int)this;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pShaderOptimizationTests.cpp"
             ,0xf2);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderOptimizationCase::init (void)
{
	const glu::RenderContext&	renderCtx	= m_context.getRenderContext();
	TestLog&					log			= m_testCtx.getLog();

	m_measurer.logParameters(log);

	for (int ndx = 0; ndx < 2; ndx++)
	{
		const bool optimized = ndx == 1;

		programData(optimized) = generateProgramData(optimized);

		for (int i = 0; i < (int)programData(optimized).attributes.size(); i++)
			DE_ASSERT(programData(optimized).attributes[i].name != "a_position"); // \note Position attribute is set by m_measurer.

		program(optimized) = SharedPtr<const ShaderProgram>(new ShaderProgram(renderCtx, programData(optimized).sources));

		{
			const tcu::ScopedLogSection section(log, optimized ? "OptimizedProgram"			: "UnoptimizedProgram",
													 optimized ? "Hand-optimized program"	: "Unoptimized program");
			log << *program(optimized);
		}

		if (!program(optimized)->isOk())
			TCU_FAIL("Shader compilation failed");
	}

	m_state = STATE_INIT_UNOPTIMIZED;
}